

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

BitMatrix * __thiscall
ZXing::Pdf417::Writer::encode
          (BitMatrix *__return_storage_ptr__,Writer *this,wstring *contents,int width,int height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int margin;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  temp;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  originalScale;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  temp_1;
  BarcodeMatrix resultMatrix;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_a8;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_88;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_68;
  BarcodeMatrix local_48;
  
  margin = 0x1e;
  if (-1 < this->_margin) {
    margin = this->_margin;
  }
  iVar2 = 2;
  if (-1 < this->_ecLevel) {
    iVar2 = this->_ecLevel;
  }
  Encoder::generateBarcodeLogic
            (&local_48,
             (this->_encoder)._M_t.
             super___uniq_ptr_impl<ZXing::Pdf417::Encoder,_std::default_delete<ZXing::Pdf417::Encoder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ZXing::Pdf417::Encoder_*,_std::default_delete<ZXing::Pdf417::Encoder>_>
             .super__Head_base<0UL,_ZXing::Pdf417::Encoder_*,_false>._M_head_impl,contents,iVar2);
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BarcodeMatrix::getScaledMatrix(&local_48,1,4,&local_88);
  bVar1 = (ulong)(((long)local_88.
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) <=
          (ulong)((local_88.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_offset +
          ((long)((local_88.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p -
          (long)((local_88.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 == width < height;
  if (bVar1) {
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RotateArray(&local_88,&local_a8);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator=(&local_88,&local_a8);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector(&local_a8);
  }
  iVar3 = width / (int)((*(int *)&((local_88.
                                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                        *(int *)&((local_88.
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) *
                        8 + ((local_88.
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  iVar2 = height / ((int)((ulong)((long)local_88.
                                        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_88.
                                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x33333333);
  if (iVar3 < iVar2) {
    iVar2 = iVar3;
  }
  if (iVar2 < 2) {
    BitMatrixFromBitArray(__return_storage_ptr__,&local_88,margin);
  }
  else {
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BarcodeMatrix::getScaledMatrix(&local_48,iVar2,iVar2 * 4,&local_a8);
    if (bVar1) {
      local_68.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      RotateArray(&local_a8,&local_68);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator=(&local_a8,&local_68);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_68);
    }
    BitMatrixFromBitArray(__return_storage_ptr__,&local_a8,margin);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::~vector(&local_a8);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_88);
  std::vector<ZXing::Pdf417::BarcodeRow,_std::allocator<ZXing::Pdf417::BarcodeRow>_>::~vector
            (&local_48._matrix);
  return __return_storage_ptr__;
}

Assistant:

BitMatrix
Writer::encode(const std::wstring& contents, int width, int height) const
{
	int margin = _margin >= 0 ? _margin : WHITE_SPACE;
	int ecLevel = _ecLevel >= 0 ? _ecLevel : DEFAULT_ERROR_CORRECTION_LEVEL;

	BarcodeMatrix resultMatrix = _encoder->generateBarcodeLogic(contents, ecLevel);
	int aspectRatio = 4; // keep in sync with MODULE_RATIO in PDFEncoder.cpp
	std::vector<std::vector<bool>> originalScale;
	resultMatrix.getScaledMatrix(1, aspectRatio, originalScale);
	bool rotated = false;
	if ((height > width) != (originalScale[0].size() < originalScale.size())) {
		std::vector<std::vector<bool>> temp;
		RotateArray(originalScale, temp);
		originalScale = temp;
		rotated = true;
	}

	int scaleX = width / Size(originalScale[0]);
	int scaleY = height / Size(originalScale);

	int scale;
	if (scaleX < scaleY) {
		scale = scaleX;
	}
	else {
		scale = scaleY;
	}

	if (scale > 1) {
		std::vector<std::vector<bool>> scaledMatrix;
		resultMatrix.getScaledMatrix(scale, scale * aspectRatio, scaledMatrix);
		if (rotated) {
			std::vector<std::vector<bool>> temp;
			RotateArray(scaledMatrix, temp);
			scaledMatrix = temp;
		}
		return BitMatrixFromBitArray(scaledMatrix, margin);
	}
	else {
		return BitMatrixFromBitArray(originalScale, margin);
	}
}